

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O2

void __thiscall
TreeNode<ObservationHistory>::SetSuccessor
          (TreeNode<ObservationHistory> *this,LIndex sucI,TreeNode<ObservationHistory> *suc)

{
  bool bVar1;
  mapped_type *ppTVar2;
  ostream *poVar3;
  E *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>,_bool>
  pVar4;
  LIndex sucI_local;
  pair<unsigned_long_long,_TreeNode<ObservationHistory>_*> arg_pair;
  stringstream ss;
  ostream local_190 [376];
  
  sucI_local = sucI;
  bVar1 = ExistsSuccessor(this,sucI);
  if (bVar1) {
    ppTVar2 = std::
              map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
              ::operator[](&this->_m_successor,&sucI_local);
    *ppTVar2 = suc;
  }
  else {
    arg_pair.first = sucI;
    arg_pair.second = suc;
    pVar4 = std::
            _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>,std::_Select1st<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>>
            ::_M_emplace_unique<std::pair<unsigned_long_long,TreeNode<ObservationHistory>*>&>
                      ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>,std::_Select1st<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>>
                        *)&this->_m_successor,&arg_pair);
    if (pVar4.second == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_190,"TreeNode<Tcontained>::SetSuccessor insertion failed, ");
      poVar3 = std::operator<<(poVar3,"but _m_successor[");
      poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
      std::operator<<(poVar3,"] wasn\'t already set ?!?");
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,&ss);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
  }
  suc->_m_pred = this;
  return;
}

Assistant:

void TreeNode<Tcontained>::SetSuccessor(LIndex sucI, 
    TreeNode<Tcontained>* suc)
{
    if( ExistsSuccessor(sucI) )
    {
#if DEBUG_TREENODE
        cout << "_m_successor["<< sucI<< "] already set: overwriting!\n";
#endif
        _m_successor[sucI] = suc;
    }
    else
    {    
        std::pair< LIndex, TreeNode<Tcontained>* > arg_pair = 
            std::make_pair(sucI, suc);
        std::pair< typename std::map< LIndex, TreeNode<Tcontained>* >::iterator, bool> 
            result_pair;
        result_pair = _m_successor.insert(arg_pair);
        if(result_pair.second == false)
        {
            std::stringstream ss;
            ss << "TreeNode<Tcontained>::SetSuccessor insertion failed, "
               << "but _m_successor["<< sucI<< "] wasn't already set ?!?";
            throw(E(ss));
        }
    }

    suc->SetPredeccessor(this);
}